

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev.c
# Opt level: O2

void evpipe_init(ev_loop *loop)

{
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  int *piVar3;
  int local_28;
  int local_24;
  int fds [2];
  
  if ((loop->pipe_w).active != 0) {
    return;
  }
  local_24 = (int)((ulong)in_RAX >> 0x20);
  _local_28 = CONCAT44(local_24,0xffffffff);
  iVar1 = eventfd(0,0x80800);
  iVar2 = -1;
  local_24 = iVar1;
  if (iVar1 < 0) {
    piVar3 = __errno_location();
    if (*piVar3 == 0x16) {
      local_24 = eventfd(0,0);
      if (-1 < local_24) goto LAB_0010775e;
    }
    while( true ) {
      iVar2 = pipe(&local_28);
      if (iVar2 == 0) break;
      ev_syserr("(libev) error creating signal/async pipe");
    }
    fd_intern(local_28);
    iVar2 = local_28;
  }
LAB_0010775e:
  loop->evpipe[0] = iVar2;
  if (loop->evpipe[1] < 0) {
    loop->evpipe[1] = local_24;
    iVar2 = local_24;
  }
  else {
    dup2(local_24,loop->evpipe[1]);
    close(local_24);
    iVar2 = loop->evpipe[1];
  }
  fd_intern(iVar2);
  iVar2 = loop->evpipe[0];
  if (iVar2 < 0) {
    iVar2 = loop->evpipe[1];
  }
  (loop->pipe_w).fd = iVar2;
  (loop->pipe_w).events = 0x81;
  ev_io_start(loop,&loop->pipe_w);
  loop->activecnt = loop->activecnt + -1;
  return;
}

Assistant:

ecb_cold
evpipe_init (EV_P)
{
  if (!ev_is_active (&pipe_w))
    {
      int fds [2];

# if EV_USE_EVENTFD
      fds [0] = -1;
      fds [1] = eventfd (0, EFD_NONBLOCK | EFD_CLOEXEC);
      if (fds [1] < 0 && errno == EINVAL)
        fds [1] = eventfd (0, 0);

      if (fds [1] < 0)
# endif
        {
          while (pipe (fds))
            ev_syserr ("(libev) error creating signal/async pipe");

          fd_intern (fds [0]);
        }

      evpipe [0] = fds [0];

      if (evpipe [1] < 0)
        evpipe [1] = fds [1]; /* first call, set write fd */
      else
        {
          /* on subsequent calls, do not change evpipe [1] */
          /* so that evpipe_write can always rely on its value. */
          /* this branch does not do anything sensible on windows, */
          /* so must not be executed on windows */

          dup2 (fds [1], evpipe [1]);
          close (fds [1]);
        }

      fd_intern (evpipe [1]);

      ev_io_set (&pipe_w, evpipe [0] < 0 ? evpipe [1] : evpipe [0], EV_READ);
      ev_io_start (EV_A_ &pipe_w);
      ev_unref (EV_A); /* watcher should not keep loop alive */
    }
}